

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_BlitScale(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,float x,float y,
                  float scaleX,float scaleY)

{
  char *pcVar1;
  GPU_ErrorEnum error;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar1 = "NULL renderer";
  }
  else {
    if (((target != (GPU_Target *)0x0) &&
        (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) &&
       (target->context != (GPU_Context *)0x0)) {
      (*_gpu_current_renderer->impl->MakeCurrent)
                (_gpu_current_renderer,target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      if (image == (GPU_Image *)0x0) {
        pcVar1 = "image";
      }
      else {
        if (target != (GPU_Target *)0x0) {
          (*_gpu_current_renderer->impl->BlitScale)
                    (_gpu_current_renderer,image,src_rect,target,x,y,scaleX,scaleY);
          return;
        }
        pcVar1 = "target";
      }
      error = GPU_ERROR_NULL_ARGUMENT;
      goto LAB_0016b5f3;
    }
    pcVar1 = "NULL context";
  }
  error = GPU_ERROR_USER_ERROR;
LAB_0016b5f3:
  GPU_PushErrorCode("GPU_BlitScale",error,"%s",pcVar1);
  return;
}

Assistant:

void GPU_BlitScale(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, float x, float y, float scaleX, float scaleY)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    if(image == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "image");
    if(target == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "target");

    _gpu_current_renderer->impl->BlitScale(_gpu_current_renderer, image, src_rect, target, x, y, scaleX, scaleY);
}